

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O2

void __thiscall ON_SHA1::set_final_hash(ON_SHA1 *this)

{
  uint uVar1;
  byte bVar2;
  long lVar3;
  ON__UINT8 byte_00;
  ON__UINT8 byte_80;
  ON__UINT8 pbFinalCount [8];
  
  uVar1 = this->m_bit_count[1];
  bVar2 = 0x18;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    pbFinalCount[lVar3] = (ON__UINT8)(uVar1 >> (bVar2 & 0x1f));
    bVar2 = bVar2 - 8;
  }
  uVar1 = this->m_bit_count[0];
  bVar2 = 0;
  for (lVar3 = 4; lVar3 != 8; lVar3 = lVar3 + 1) {
    pbFinalCount[lVar3] = (ON__UINT8)(uVar1 >> (~bVar2 & 0x18));
    bVar2 = bVar2 + 8;
  }
  byte_80 = 0x80;
  Internal_Accumulate(this,&byte_80,1);
  byte_00 = '\0';
  while ((this->m_bit_count[0] & 0x1f8) != 0x1c0) {
    Internal_Accumulate(this,&byte_00,1);
  }
  Internal_Accumulate(this,pbFinalCount,8);
  bVar2 = 0;
  for (lVar3 = 0; lVar3 != 0x14; lVar3 = lVar3 + 1) {
    (this->m_sha1_hash).m_digest[lVar3] =
         (ON__UINT8)
         (*(uint *)((long)this->m_state + (ulong)((uint)lVar3 & 0xfffffffc)) >> (~bVar2 & 0x18));
    bVar2 = bVar2 + 8;
  }
  return;
}

Assistant:

void ON_SHA1::set_final_hash()
{
  ON__UINT32 i;
  ON__UINT32 bit_count;
  ON__UINT8 pbFinalCount[8];
  bit_count = m_bit_count[1];
  for (i = 0; i < 4; ++i)
    pbFinalCount[i] = static_cast<ON__UINT8>((bit_count >> ((3 - (i & 3)) * 8)) & 0xFF); // Endian independent
  bit_count = m_bit_count[0];
  for (i = 4; i < 8; ++i)
    pbFinalCount[i] = static_cast<ON__UINT8>((bit_count >> ((3 - (i & 3)) * 8)) & 0xFF); // Endian independent

  //update((ON__UINT8*)"\200", 1);
  const ON__UINT8 byte_80 = 0x80U;
  Internal_Accumulate(&byte_80, 1);

  const ON__UINT8 byte_00 = 0U;
  while ((m_bit_count[0] & 504) != 448)
    Internal_Accumulate(&byte_00, 1);
    //Internal_Accumulate((ON__UINT8*)"\0", 1);

  Internal_Accumulate(pbFinalCount, 8); // Cause a transform()

  for (i = 0; i < 20; ++i)
    m_sha1_hash.m_digest[i] = static_cast<ON__UINT8>((m_state[i >> 2] >> ((3 - (i & 3)) * 8)) & 0xFF);
}